

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_hash_set_unittests.cc
# Opt level: O0

void __thiscall DenseHashSet_TestEmplaceHint_Test::TestBody(DenseHashSet_TestEmplaceHint_Test *this)

{
  const_iterator hint;
  bool bVar1;
  char *file;
  char *message;
  AssertionResult gtest_ar;
  iterator it;
  char *str2;
  char *str1;
  dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
  set;
  key_type *in_stack_fffffffffffffe88;
  allocator_type *in_stack_fffffffffffffe90;
  key_equal *in_stack_fffffffffffffe98;
  hasher *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int line;
  dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
  *in_stack_fffffffffffffeb0;
  libc_allocator_with_realloc<const_char_*> *this_00;
  Type type;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  char **in_stack_fffffffffffffee8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertHelper *pAStack_c0;
  unsigned_long *local_b8;
  libc_allocator_with_realloc<const_char_*> local_63 [99];
  
  this_00 = local_63;
  google::libc_allocator_with_realloc<const_char_*>::libc_allocator_with_realloc(this_00);
  google::
  dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
  ::dense_hash_set(in_stack_fffffffffffffeb0,
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  google::libc_allocator_with_realloc<const_char_*>::~libc_allocator_with_realloc(local_63);
  google::
  dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
  ::set_empty_key((dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
                   *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  google::
  dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
  ::insert((dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
            *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),(value_type *)this_00);
  type = (Type)((ulong)this_00 >> 0x20);
  google::
  dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
  ::begin((dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
           *)in_stack_fffffffffffffe90);
  hint.pos = (pointer)in_stack_ffffffffffffff08;
  hint.ht = (dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
             *)in_stack_ffffffffffffff00;
  hint.end = (pointer)in_stack_ffffffffffffff10;
  google::
  dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>
  ::emplace_hint<char_const*&>
            ((dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
              *)in_stack_fffffffffffffef0._M_head_impl,hint,in_stack_fffffffffffffee8);
  file = (char *)google::
                 dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
                 ::size((dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
                         *)0x10bb120);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (char *)in_stack_fffffffffffffea0,local_b8,(unsigned_long *)pAStack_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffee8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    message = testing::AssertionResult::failure_message((AssertionResult *)0x10bb1eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),type,
               file,line,message);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper(pAStack_c0);
    testing::Message::~Message((Message *)0x10bb239);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bb295);
  google::
  dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
  ::~dense_hash_set((dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
                     *)0x10bb2b4);
  return;
}

Assistant:

TEST(DenseHashSet, TestEmplaceHint) {
	dense_hash_set<const char *> set;
	set.set_empty_key(nullptr);

	const char * str1 = "Hello";
	const char * str2 = "World";

	set.insert(str1);
	auto it = set.begin();
	set.emplace_hint(it, str2);

	ASSERT_EQ(set.size(), 2ul);
}